

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_smooth_h_predictor_64x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  uint uVar21;
  uint8_t *puVar22;
  short sVar23;
  short sVar24;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  undefined1 auVar25 [16];
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  ushort uVar99;
  ushort uVar100;
  ushort uVar101;
  ushort uVar102;
  ushort uVar103;
  ushort uVar104;
  undefined1 auVar90 [16];
  undefined1 auVar105 [16];
  short sVar106;
  ushort uVar107;
  ushort uVar108;
  short sVar110;
  ushort uVar111;
  ushort uVar112;
  short sVar113;
  ushort uVar114;
  ushort uVar115;
  short sVar116;
  ushort uVar117;
  ushort uVar118;
  short sVar119;
  ushort uVar120;
  ushort uVar121;
  short sVar122;
  ushort uVar123;
  ushort uVar124;
  short sVar125;
  ushort uVar126;
  ushort uVar127;
  short sVar128;
  ushort uVar129;
  ushort uVar130;
  undefined1 auVar109 [16];
  
  auVar25 = pshuflw(ZEXT116(top_row[0x3f]),ZEXT116(top_row[0x3f]),0);
  uVar1 = *(ulong *)left_column;
  sVar23 = auVar25._0_2_;
  sVar32 = auVar25._2_2_;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5._12_3_ = auVar3._12_3_;
  auVar7._8_2_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7[10] = (char)(uVar1 >> 0x28);
  auVar7._11_4_ = auVar5._11_4_;
  auVar9._8_2_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9._10_5_ = auVar7._10_5_;
  auVar11[8] = (char)(uVar1 >> 0x20);
  auVar11._0_8_ = uVar1;
  auVar11._9_6_ = auVar9._9_6_;
  auVar15._7_8_ = 0;
  auVar15._0_7_ = auVar11._8_7_;
  auVar17._1_8_ = SUB158(auVar15 << 0x40,7);
  auVar17[0] = (char)(uVar1 >> 0x18);
  auVar17._9_6_ = 0;
  auVar18._1_10_ = SUB1510(auVar17 << 0x30,5);
  auVar18[0] = (char)(uVar1 >> 0x10);
  auVar18._11_4_ = 0;
  auVar14[2] = (char)(uVar1 >> 8);
  auVar14._0_2_ = (ushort)uVar1;
  auVar14._3_12_ = SUB1512(auVar18 << 0x20,3);
  auVar25._0_2_ = (ushort)uVar1 & 0xff;
  auVar25._2_13_ = auVar14._2_13_;
  auVar25[0xf] = 0;
  sVar33 = sVar32 * 8 + 0x80;
  sVar34 = sVar23 * 0x10 + 0x80;
  sVar35 = sVar32 * 0x17 + 0x80;
  sVar36 = sVar23 * 0x1f + 0x80;
  sVar37 = sVar32 * 0x26 + 0x80;
  sVar38 = sVar23 * 0x2e + 0x80;
  sVar39 = sVar32 * 0x35 + 0x80;
  sVar40 = sVar23 * 0x3c + 0x80;
  sVar41 = sVar32 * 0x43 + 0x80;
  sVar42 = sVar23 * 0x4a + 0x80;
  sVar43 = sVar32 * 0x50 + 0x80;
  sVar44 = sVar23 * 0x57 + 0x80;
  sVar45 = sVar32 * 0x5d + 0x80;
  sVar46 = sVar23 * 100 + 0x80;
  sVar47 = sVar32 * 0x6a + 0x80;
  sVar48 = sVar23 * 0x70 + 0x80;
  sVar49 = sVar32 * 0x76 + 0x80;
  sVar50 = sVar23 * 0x7b + 0x80;
  sVar51 = sVar32 * 0x81 + 0x80;
  sVar52 = sVar23 * 0x87 + 0x80;
  sVar53 = sVar32 * 0x8c + 0x80;
  sVar54 = sVar23 * 0x91 + 0x80;
  sVar55 = sVar32 * 0x96 + 0x80;
  sVar56 = sVar23 * 0x9b + 0x80;
  sVar57 = sVar32 * 0xa0 + 0x80;
  sVar58 = sVar23 * 0xa5 + 0x80;
  sVar59 = sVar32 * 0xaa + 0x80;
  sVar60 = sVar23 * 0xae + 0x80;
  sVar61 = sVar32 * 0xb3 + 0x80;
  sVar62 = sVar23 * 0xb7 + 0x80;
  sVar63 = sVar32 * 0xbb + 0x80;
  sVar64 = sVar23 * 0xbf + 0x80;
  sVar65 = sVar32 * 0xc3 + 0x80;
  sVar66 = sVar23 * 199 + 0x80;
  sVar67 = sVar32 * 0xca + 0x80;
  sVar68 = sVar23 * 0xce + 0x80;
  sVar69 = sVar32 * 0xd1 + 0x80;
  sVar70 = sVar23 * 0xd4 + 0x80;
  sVar71 = sVar32 * 0xd7 + 0x80;
  sVar72 = sVar23 * 0xda + 0x80;
  sVar73 = sVar32 * 0xdd + 0x80;
  sVar74 = sVar23 * 0xe0 + 0x80;
  sVar75 = sVar32 * 0xe3 + 0x80;
  sVar76 = sVar23 * 0xe5 + 0x80;
  sVar77 = sVar32 * 0xe7 + 0x80;
  sVar78 = sVar23 * 0xea + 0x80;
  sVar79 = sVar32 * 0xec + 0x80;
  sVar80 = sVar23 * 0xee + 0x80;
  sVar81 = sVar32 * 0xf0 + 0x80;
  sVar82 = sVar23 * 0xf1 + 0x80;
  sVar83 = sVar32 * 0xf3 + 0x80;
  sVar84 = sVar23 * 0xf4 + 0x80;
  sVar85 = sVar32 * 0xf6 + 0x80;
  sVar86 = sVar23 * 0xf7 + 0x80;
  sVar87 = sVar32 * 0xf8 + 0x80;
  sVar24 = sVar23 * 0xf9 + 0x80;
  sVar26 = sVar32 * 0xfa + 0x80;
  sVar27 = sVar23 * 0xfa + 0x80;
  sVar28 = sVar32 * 0xfb + 0x80;
  sVar29 = sVar23 * 0xfb + 0x80;
  sVar30 = sVar32 * 0xfc + 0x80;
  sVar31 = sVar23 * 0xfc + 0x80;
  sVar32 = sVar32 * 0xfc + 0x80;
  puVar22 = dst + 0x30;
  uVar21 = 0xfefdfefe;
  do {
    uVar21 = uVar21 + 0x2020202;
    auVar105._4_4_ = uVar21;
    auVar105._0_4_ = uVar21;
    auVar105._8_4_ = uVar21;
    auVar105._12_4_ = uVar21;
    auVar105 = pshufb(auVar25,auVar105);
    sVar106 = auVar105._0_2_;
    sVar110 = auVar105._2_2_;
    sVar113 = auVar105._4_2_;
    sVar116 = auVar105._6_2_;
    sVar119 = auVar105._8_2_;
    sVar122 = auVar105._10_2_;
    sVar125 = auVar105._12_2_;
    sVar128 = auVar105._14_2_;
    uVar107 = sVar106 * 0xff + sVar23 + 0x80;
    uVar111 = sVar110 * 0xf8 + sVar33;
    uVar114 = sVar113 * 0xf0 + sVar34;
    uVar117 = sVar116 * 0xe9 + sVar35;
    uVar120 = sVar119 * 0xe1 + sVar36;
    uVar123 = sVar122 * 0xda + sVar37;
    uVar126 = sVar125 * 0xd2 + sVar38;
    uVar129 = sVar128 * 0xcb + sVar39;
    uVar108 = uVar107 >> 8;
    uVar112 = uVar111 >> 8;
    uVar115 = uVar114 >> 8;
    uVar118 = uVar117 >> 8;
    uVar121 = uVar120 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = uVar126 >> 8;
    uVar130 = uVar129 >> 8;
    uVar88 = sVar106 * 0xc4 + sVar40;
    uVar91 = sVar110 * 0xbd + sVar41;
    uVar93 = sVar113 * 0xb6 + sVar42;
    uVar95 = sVar116 * 0xb0 + sVar43;
    uVar97 = sVar119 * 0xa9 + sVar44;
    uVar99 = sVar122 * 0xa3 + sVar45;
    uVar101 = sVar125 * 0x9c + sVar46;
    uVar103 = sVar128 * 0x96 + sVar47;
    uVar89 = uVar88 >> 8;
    uVar92 = uVar91 >> 8;
    uVar94 = uVar93 >> 8;
    uVar96 = uVar95 >> 8;
    uVar98 = uVar97 >> 8;
    uVar100 = uVar99 >> 8;
    uVar102 = uVar101 >> 8;
    uVar104 = uVar103 >> 8;
    puVar22[-0x30] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar22[-0x2f] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar22[-0x2e] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar22[-0x2d] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar22[-0x2c] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar22[-0x2b] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar22[-0x2a] = (uVar127 != 0) * (uVar127 < 0x100) * (char)(uVar126 >> 8) - (0xff < uVar127);
    puVar22[-0x29] = (uVar130 != 0) * (uVar130 < 0x100) * (char)(uVar129 >> 8) - (0xff < uVar130);
    puVar22[-0x28] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
    puVar22[-0x27] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
    puVar22[-0x26] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar22[-0x25] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
    puVar22[-0x24] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar98);
    puVar22[-0x23] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar22[-0x22] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar22[-0x21] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    uVar88 = sVar106 * 0x90 + sVar48;
    uVar91 = sVar110 * 0x8a + sVar49;
    uVar93 = sVar113 * 0x85 + sVar50;
    uVar95 = sVar116 * 0x7f + sVar51;
    uVar97 = sVar119 * 0x79 + sVar52;
    uVar99 = sVar122 * 0x74 + sVar53;
    uVar101 = sVar125 * 0x6f + sVar54;
    uVar103 = sVar128 * 0x6a + sVar55;
    uVar89 = uVar88 >> 8;
    uVar92 = uVar91 >> 8;
    uVar94 = uVar93 >> 8;
    uVar96 = uVar95 >> 8;
    uVar98 = uVar97 >> 8;
    uVar100 = uVar99 >> 8;
    uVar102 = uVar101 >> 8;
    uVar104 = uVar103 >> 8;
    uVar107 = sVar106 * 0x65 + sVar56;
    uVar111 = sVar110 * 0x60 + sVar57;
    uVar114 = sVar113 * 0x5b + sVar58;
    uVar117 = sVar116 * 0x56 + sVar59;
    uVar120 = sVar119 * 0x52 + sVar60;
    uVar123 = sVar122 * 0x4d + sVar61;
    uVar126 = sVar125 * 0x49 + sVar62;
    uVar129 = sVar128 * 0x45 + sVar63;
    uVar108 = uVar107 >> 8;
    uVar112 = uVar111 >> 8;
    uVar115 = uVar114 >> 8;
    uVar118 = uVar117 >> 8;
    uVar121 = uVar120 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = uVar126 >> 8;
    uVar130 = uVar129 >> 8;
    puVar22[-0x20] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
    puVar22[-0x1f] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
    puVar22[-0x1e] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar22[-0x1d] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
    puVar22[-0x1c] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar98);
    puVar22[-0x1b] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar22[-0x1a] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar22[-0x19] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar22[-0x18] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar22[-0x17] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar22[-0x16] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar22[-0x15] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar22[-0x14] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar22[-0x13] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar22[-0x12] = (uVar127 != 0) * (uVar127 < 0x100) * (char)(uVar126 >> 8) - (0xff < uVar127);
    puVar22[-0x11] = (uVar130 != 0) * (uVar130 < 0x100) * (char)(uVar129 >> 8) - (0xff < uVar130);
    uVar88 = sVar106 * 0x41 + sVar64;
    uVar91 = sVar110 * 0x3d + sVar65;
    uVar93 = sVar113 * 0x39 + sVar66;
    uVar95 = sVar116 * 0x36 + sVar67;
    uVar97 = sVar119 * 0x32 + sVar68;
    uVar99 = sVar122 * 0x2f + sVar69;
    uVar101 = sVar125 * 0x2c + sVar70;
    uVar103 = sVar128 * 0x29 + sVar71;
    uVar89 = uVar88 >> 8;
    uVar92 = uVar91 >> 8;
    uVar94 = uVar93 >> 8;
    uVar96 = uVar95 >> 8;
    uVar98 = uVar97 >> 8;
    uVar100 = uVar99 >> 8;
    uVar102 = uVar101 >> 8;
    uVar104 = uVar103 >> 8;
    uVar107 = sVar106 * 0x26 + sVar72;
    uVar111 = sVar110 * 0x23 + sVar73;
    uVar114 = sVar113 * 0x20 + sVar74;
    uVar117 = sVar116 * 0x1d + sVar75;
    uVar120 = sVar119 * 0x1b + sVar76;
    uVar123 = sVar122 * 0x19 + sVar77;
    uVar126 = sVar125 * 0x16 + sVar78;
    uVar129 = sVar128 * 0x14 + sVar79;
    uVar108 = uVar107 >> 8;
    uVar112 = uVar111 >> 8;
    uVar115 = uVar114 >> 8;
    uVar118 = uVar117 >> 8;
    uVar121 = uVar120 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = uVar126 >> 8;
    uVar130 = uVar129 >> 8;
    puVar22[-0x10] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
    puVar22[-0xf] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
    puVar22[-0xe] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar22[-0xd] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
    puVar22[-0xc] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar98);
    puVar22[-0xb] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar22[-10] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar22[-9] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar22[-8] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar22[-7] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar22[-6] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar22[-5] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar22[-4] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar22[-3] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar22[-2] = (uVar127 != 0) * (uVar127 < 0x100) * (char)(uVar126 >> 8) - (0xff < uVar127);
    puVar22[-1] = (uVar130 != 0) * (uVar130 < 0x100) * (char)(uVar129 >> 8) - (0xff < uVar130);
    uVar88 = sVar106 * 0x12 + sVar80;
    uVar91 = sVar110 * 0x10 + sVar81;
    uVar93 = sVar113 * 0xf + sVar82;
    uVar95 = sVar116 * 0xd + sVar83;
    uVar97 = sVar119 * 0xc + sVar84;
    uVar99 = sVar122 * 10 + sVar85;
    uVar101 = sVar125 * 9 + sVar86;
    uVar103 = sVar128 * 8 + sVar87;
    uVar89 = uVar88 >> 8;
    uVar92 = uVar91 >> 8;
    uVar94 = uVar93 >> 8;
    uVar96 = uVar95 >> 8;
    uVar98 = uVar97 >> 8;
    uVar100 = uVar99 >> 8;
    uVar102 = uVar101 >> 8;
    uVar104 = uVar103 >> 8;
    uVar107 = sVar106 * 7 + sVar24;
    uVar111 = sVar110 * 6 + sVar26;
    uVar114 = sVar113 * 6 + sVar27;
    uVar117 = sVar116 * 5 + sVar28;
    uVar120 = sVar119 * 5 + sVar29;
    uVar123 = sVar122 * 4 + sVar30;
    uVar126 = sVar125 * 4 + sVar31;
    uVar129 = sVar128 * 4 + sVar32;
    uVar108 = uVar107 >> 8;
    uVar112 = uVar111 >> 8;
    uVar115 = uVar114 >> 8;
    uVar118 = uVar117 >> 8;
    uVar121 = uVar120 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = uVar126 >> 8;
    uVar130 = uVar129 >> 8;
    *puVar22 = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
    puVar22[1] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
    puVar22[2] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar22[3] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
    puVar22[4] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar98);
    puVar22[5] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar22[6] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar22[7] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar22[8] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar22[9] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar22[10] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar22[0xb] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar22[0xc] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar22[0xd] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar22[0xe] = (uVar127 != 0) * (uVar127 < 0x100) * (char)(uVar126 >> 8) - (0xff < uVar127);
    puVar22[0xf] = (uVar130 != 0) * (uVar130 < 0x100) * (char)(uVar129 >> 8) - (0xff < uVar130);
    puVar22 = puVar22 + stride;
  } while (uVar21 < 0xd0c0d0d);
  uVar1 = *(ulong *)(left_column + 8);
  auVar4._8_6_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4[0xe] = (char)(uVar1 >> 0x38);
  auVar6._8_4_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6[0xc] = (char)(uVar1 >> 0x30);
  auVar6._13_2_ = auVar4._13_2_;
  auVar8._8_4_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8._12_3_ = auVar6._12_3_;
  auVar10._8_2_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10[10] = (char)(uVar1 >> 0x28);
  auVar10._11_4_ = auVar8._11_4_;
  auVar12._8_2_ = 0;
  auVar12._0_8_ = uVar1;
  auVar12._10_5_ = auVar10._10_5_;
  auVar13[8] = (char)(uVar1 >> 0x20);
  auVar13._0_8_ = uVar1;
  auVar13._9_6_ = auVar12._9_6_;
  auVar16._7_8_ = 0;
  auVar16._0_7_ = auVar13._8_7_;
  auVar19._1_8_ = SUB158(auVar16 << 0x40,7);
  auVar19[0] = (char)(uVar1 >> 0x18);
  auVar19._9_6_ = 0;
  auVar20._1_10_ = SUB1510(auVar19 << 0x30,5);
  auVar20[0] = (char)(uVar1 >> 0x10);
  auVar20._11_4_ = 0;
  auVar90._3_12_ = SUB1512(auVar20 << 0x20,3);
  auVar90[2] = (char)(uVar1 >> 8);
  auVar90[0] = (byte)uVar1;
  auVar90[1] = 0;
  auVar90[0xf] = 0;
  uVar21 = 0xfefdfefe;
  do {
    uVar21 = uVar21 + 0x2020202;
    auVar109._4_4_ = uVar21;
    auVar109._0_4_ = uVar21;
    auVar109._8_4_ = uVar21;
    auVar109._12_4_ = uVar21;
    auVar25 = pshufb(auVar90,auVar109);
    sVar106 = auVar25._0_2_;
    sVar110 = auVar25._2_2_;
    sVar113 = auVar25._4_2_;
    sVar116 = auVar25._6_2_;
    sVar119 = auVar25._8_2_;
    sVar122 = auVar25._10_2_;
    sVar125 = auVar25._12_2_;
    sVar128 = auVar25._14_2_;
    uVar88 = sVar106 * 0xff + sVar23 + 0x80;
    uVar91 = sVar110 * 0xf8 + sVar33;
    uVar93 = sVar113 * 0xf0 + sVar34;
    uVar95 = sVar116 * 0xe9 + sVar35;
    uVar97 = sVar119 * 0xe1 + sVar36;
    uVar99 = sVar122 * 0xda + sVar37;
    uVar101 = sVar125 * 0xd2 + sVar38;
    uVar103 = sVar128 * 0xcb + sVar39;
    uVar89 = uVar88 >> 8;
    uVar92 = uVar91 >> 8;
    uVar94 = uVar93 >> 8;
    uVar96 = uVar95 >> 8;
    uVar98 = uVar97 >> 8;
    uVar100 = uVar99 >> 8;
    uVar102 = uVar101 >> 8;
    uVar104 = uVar103 >> 8;
    uVar107 = sVar106 * 0xc4 + sVar40;
    uVar111 = sVar110 * 0xbd + sVar41;
    uVar114 = sVar113 * 0xb6 + sVar42;
    uVar117 = sVar116 * 0xb0 + sVar43;
    uVar120 = sVar119 * 0xa9 + sVar44;
    uVar123 = sVar122 * 0xa3 + sVar45;
    uVar126 = sVar125 * 0x9c + sVar46;
    uVar129 = sVar128 * 0x96 + sVar47;
    uVar108 = uVar107 >> 8;
    uVar112 = uVar111 >> 8;
    uVar115 = uVar114 >> 8;
    uVar118 = uVar117 >> 8;
    uVar121 = uVar120 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = uVar126 >> 8;
    uVar130 = uVar129 >> 8;
    puVar22[-0x30] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
    puVar22[-0x2f] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
    puVar22[-0x2e] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar22[-0x2d] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
    puVar22[-0x2c] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar98);
    puVar22[-0x2b] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar22[-0x2a] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar22[-0x29] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar22[-0x28] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar22[-0x27] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar22[-0x26] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar22[-0x25] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar22[-0x24] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar22[-0x23] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar22[-0x22] = (uVar127 != 0) * (uVar127 < 0x100) * (char)(uVar126 >> 8) - (0xff < uVar127);
    puVar22[-0x21] = (uVar130 != 0) * (uVar130 < 0x100) * (char)(uVar129 >> 8) - (0xff < uVar130);
    uVar88 = sVar106 * 0x90 + sVar48;
    uVar91 = sVar110 * 0x8a + sVar49;
    uVar93 = sVar113 * 0x85 + sVar50;
    uVar95 = sVar116 * 0x7f + sVar51;
    uVar97 = sVar119 * 0x79 + sVar52;
    uVar99 = sVar122 * 0x74 + sVar53;
    uVar101 = sVar125 * 0x6f + sVar54;
    uVar103 = sVar128 * 0x6a + sVar55;
    uVar89 = uVar88 >> 8;
    uVar92 = uVar91 >> 8;
    uVar94 = uVar93 >> 8;
    uVar96 = uVar95 >> 8;
    uVar98 = uVar97 >> 8;
    uVar100 = uVar99 >> 8;
    uVar102 = uVar101 >> 8;
    uVar104 = uVar103 >> 8;
    uVar107 = sVar106 * 0x65 + sVar56;
    uVar111 = sVar110 * 0x60 + sVar57;
    uVar114 = sVar113 * 0x5b + sVar58;
    uVar117 = sVar116 * 0x56 + sVar59;
    uVar120 = sVar119 * 0x52 + sVar60;
    uVar123 = sVar122 * 0x4d + sVar61;
    uVar126 = sVar125 * 0x49 + sVar62;
    uVar129 = sVar128 * 0x45 + sVar63;
    uVar108 = uVar107 >> 8;
    uVar112 = uVar111 >> 8;
    uVar115 = uVar114 >> 8;
    uVar118 = uVar117 >> 8;
    uVar121 = uVar120 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = uVar126 >> 8;
    uVar130 = uVar129 >> 8;
    puVar22[-0x20] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
    puVar22[-0x1f] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
    puVar22[-0x1e] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar22[-0x1d] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
    puVar22[-0x1c] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar98);
    puVar22[-0x1b] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar22[-0x1a] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar22[-0x19] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar22[-0x18] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar22[-0x17] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar22[-0x16] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar22[-0x15] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar22[-0x14] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar22[-0x13] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar22[-0x12] = (uVar127 != 0) * (uVar127 < 0x100) * (char)(uVar126 >> 8) - (0xff < uVar127);
    puVar22[-0x11] = (uVar130 != 0) * (uVar130 < 0x100) * (char)(uVar129 >> 8) - (0xff < uVar130);
    uVar88 = sVar106 * 0x41 + sVar64;
    uVar91 = sVar110 * 0x3d + sVar65;
    uVar93 = sVar113 * 0x39 + sVar66;
    uVar95 = sVar116 * 0x36 + sVar67;
    uVar97 = sVar119 * 0x32 + sVar68;
    uVar99 = sVar122 * 0x2f + sVar69;
    uVar101 = sVar125 * 0x2c + sVar70;
    uVar103 = sVar128 * 0x29 + sVar71;
    uVar89 = uVar88 >> 8;
    uVar92 = uVar91 >> 8;
    uVar94 = uVar93 >> 8;
    uVar96 = uVar95 >> 8;
    uVar98 = uVar97 >> 8;
    uVar100 = uVar99 >> 8;
    uVar102 = uVar101 >> 8;
    uVar104 = uVar103 >> 8;
    uVar107 = sVar106 * 0x26 + sVar72;
    uVar111 = sVar110 * 0x23 + sVar73;
    uVar114 = sVar113 * 0x20 + sVar74;
    uVar117 = sVar116 * 0x1d + sVar75;
    uVar120 = sVar119 * 0x1b + sVar76;
    uVar123 = sVar122 * 0x19 + sVar77;
    uVar126 = sVar125 * 0x16 + sVar78;
    uVar129 = sVar128 * 0x14 + sVar79;
    uVar108 = uVar107 >> 8;
    uVar112 = uVar111 >> 8;
    uVar115 = uVar114 >> 8;
    uVar118 = uVar117 >> 8;
    uVar121 = uVar120 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = uVar126 >> 8;
    uVar130 = uVar129 >> 8;
    puVar22[-0x10] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
    puVar22[-0xf] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
    puVar22[-0xe] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar22[-0xd] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
    puVar22[-0xc] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar98);
    puVar22[-0xb] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar22[-10] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar22[-9] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar22[-8] = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar22[-7] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar22[-6] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar22[-5] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar22[-4] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar22[-3] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar22[-2] = (uVar127 != 0) * (uVar127 < 0x100) * (char)(uVar126 >> 8) - (0xff < uVar127);
    puVar22[-1] = (uVar130 != 0) * (uVar130 < 0x100) * (char)(uVar129 >> 8) - (0xff < uVar130);
    uVar107 = sVar106 * 0x12 + sVar80;
    uVar111 = sVar110 * 0x10 + sVar81;
    uVar114 = sVar113 * 0xf + sVar82;
    uVar117 = sVar116 * 0xd + sVar83;
    uVar120 = sVar119 * 0xc + sVar84;
    uVar123 = sVar122 * 10 + sVar85;
    uVar126 = sVar125 * 9 + sVar86;
    uVar129 = sVar128 * 8 + sVar87;
    uVar108 = uVar107 >> 8;
    uVar112 = uVar111 >> 8;
    uVar115 = uVar114 >> 8;
    uVar118 = uVar117 >> 8;
    uVar121 = uVar120 >> 8;
    uVar124 = uVar123 >> 8;
    uVar127 = uVar126 >> 8;
    uVar130 = uVar129 >> 8;
    uVar88 = sVar106 * 7 + sVar24;
    uVar91 = sVar110 * 6 + sVar26;
    uVar93 = sVar113 * 6 + sVar27;
    uVar95 = sVar116 * 5 + sVar28;
    uVar97 = sVar119 * 5 + sVar29;
    uVar99 = sVar122 * 4 + sVar30;
    uVar101 = sVar125 * 4 + sVar31;
    uVar103 = sVar128 * 4 + sVar32;
    uVar89 = uVar88 >> 8;
    uVar92 = uVar91 >> 8;
    uVar94 = uVar93 >> 8;
    uVar96 = uVar95 >> 8;
    uVar98 = uVar97 >> 8;
    uVar100 = uVar99 >> 8;
    uVar102 = uVar101 >> 8;
    uVar104 = uVar103 >> 8;
    *puVar22 = (uVar108 != 0) * (uVar108 < 0x100) * (char)(uVar107 >> 8) - (0xff < uVar108);
    puVar22[1] = (uVar112 != 0) * (uVar112 < 0x100) * (char)(uVar111 >> 8) - (0xff < uVar112);
    puVar22[2] = (uVar115 != 0) * (uVar115 < 0x100) * (char)(uVar114 >> 8) - (0xff < uVar115);
    puVar22[3] = (uVar118 != 0) * (uVar118 < 0x100) * (char)(uVar117 >> 8) - (0xff < uVar118);
    puVar22[4] = (uVar121 != 0) * (uVar121 < 0x100) * (char)(uVar120 >> 8) - (0xff < uVar121);
    puVar22[5] = (uVar124 != 0) * (uVar124 < 0x100) * (char)(uVar123 >> 8) - (0xff < uVar124);
    puVar22[6] = (uVar127 != 0) * (uVar127 < 0x100) * (char)(uVar126 >> 8) - (0xff < uVar127);
    puVar22[7] = (uVar130 != 0) * (uVar130 < 0x100) * (char)(uVar129 >> 8) - (0xff < uVar130);
    puVar22[8] = (uVar89 != 0) * (uVar89 < 0x100) * (char)(uVar88 >> 8) - (0xff < uVar89);
    puVar22[9] = (uVar92 != 0) * (uVar92 < 0x100) * (char)(uVar91 >> 8) - (0xff < uVar92);
    puVar22[10] = (uVar94 != 0) * (uVar94 < 0x100) * (char)(uVar93 >> 8) - (0xff < uVar94);
    puVar22[0xb] = (uVar96 != 0) * (uVar96 < 0x100) * (char)(uVar95 >> 8) - (0xff < uVar96);
    puVar22[0xc] = (uVar98 != 0) * (uVar98 < 0x100) * (char)(uVar97 >> 8) - (0xff < uVar98);
    puVar22[0xd] = (uVar100 != 0) * (uVar100 < 0x100) * (char)(uVar99 >> 8) - (0xff < uVar100);
    puVar22[0xe] = (uVar102 != 0) * (uVar102 < 0x100) * (char)(uVar101 >> 8) - (0xff < uVar102);
    puVar22[0xf] = (uVar104 != 0) * (uVar104 < 0x100) * (char)(uVar103 >> 8) - (0xff < uVar104);
    puVar22 = puVar22 + stride;
  } while (uVar21 < 0xd0c0d0d);
  return;
}

Assistant:

void aom_smooth_h_predictor_64x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[63]);
  const __m128i left1 = cvtepu8_epi16(LoadLo8(left_column));
  const __m128i weights_lolo = LoadUnaligned16(smooth_weights + 60);
  const __m128i weights_lohi = LoadUnaligned16(smooth_weights + 76);
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights1 = cvtepu8_epi16(weights_lolo);
  const __m128i weights2 = cvtepu8_epi16(_mm_srli_si128(weights_lolo, 8));
  const __m128i weights3 = cvtepu8_epi16(weights_lohi);
  const __m128i weights4 = cvtepu8_epi16(_mm_srli_si128(weights_lohi, 8));
  const __m128i inverted_weights1 = _mm_sub_epi16(scale, weights1);
  const __m128i inverted_weights2 = _mm_sub_epi16(scale, weights2);
  const __m128i inverted_weights3 = _mm_sub_epi16(scale, weights3);
  const __m128i inverted_weights4 = _mm_sub_epi16(scale, weights4);
  const __m128i scaled_top_right1 =
      _mm_mullo_epi16(inverted_weights1, top_right);
  const __m128i scaled_top_right2 =
      _mm_mullo_epi16(inverted_weights2, top_right);
  const __m128i scaled_top_right3 =
      _mm_mullo_epi16(inverted_weights3, top_right);
  const __m128i scaled_top_right4 =
      _mm_mullo_epi16(inverted_weights4, top_right);
  const __m128i weights_hilo = LoadUnaligned16(smooth_weights + 92);
  const __m128i weights_hihi = LoadUnaligned16(smooth_weights + 108);
  const __m128i weights5 = cvtepu8_epi16(weights_hilo);
  const __m128i weights6 = cvtepu8_epi16(_mm_srli_si128(weights_hilo, 8));
  const __m128i weights7 = cvtepu8_epi16(weights_hihi);
  const __m128i weights8 = cvtepu8_epi16(_mm_srli_si128(weights_hihi, 8));
  const __m128i inverted_weights5 = _mm_sub_epi16(scale, weights5);
  const __m128i inverted_weights6 = _mm_sub_epi16(scale, weights6);
  const __m128i inverted_weights7 = _mm_sub_epi16(scale, weights7);
  const __m128i inverted_weights8 = _mm_sub_epi16(scale, weights8);
  const __m128i scaled_top_right5 =
      _mm_mullo_epi16(inverted_weights5, top_right);
  const __m128i scaled_top_right6 =
      _mm_mullo_epi16(inverted_weights6, top_right);
  const __m128i scaled_top_right7 =
      _mm_mullo_epi16(inverted_weights7, top_right);
  const __m128i scaled_top_right8 =
      _mm_mullo_epi16(inverted_weights8, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    __m128i left_y = _mm_shuffle_epi8(left1, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5, weights6,
                                   scaled_top_right5, scaled_top_right6, round);
    write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7, weights8,
                                   scaled_top_right7, scaled_top_right8, round);
    dst += stride;
  }
  const __m128i left2 = cvtepu8_epi16(LoadLo8(left_column + 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    __m128i y_select = _mm_set1_epi32(y_mask);
    __m128i left_y = _mm_shuffle_epi8(left2, y_select);
    write_smooth_directional_sum16(dst, left_y, left_y, weights1, weights2,
                                   scaled_top_right1, scaled_top_right2, round);
    write_smooth_directional_sum16(dst + 16, left_y, left_y, weights3, weights4,
                                   scaled_top_right3, scaled_top_right4, round);
    write_smooth_directional_sum16(dst + 32, left_y, left_y, weights5, weights6,
                                   scaled_top_right5, scaled_top_right6, round);
    write_smooth_directional_sum16(dst + 48, left_y, left_y, weights7, weights8,
                                   scaled_top_right7, scaled_top_right8, round);
    dst += stride;
  }
}